

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.h
# Opt level: O2

bool operator<(CPubKey *a,CPubKey *b)

{
  byte bVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  size_t __n;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = a->vch[0];
  bVar3 = true;
  if (b->vch[0] <= bVar1) {
    if (bVar1 == b->vch[0]) {
      if ((bVar1 & 0xfe) == 2) {
        __n = 0x21;
      }
      else if ((byte)(bVar1 - 4) < 4) {
        __n = *(size_t *)(&DAT_002229b0 + (ulong)(byte)(bVar1 - 4) * 8);
      }
      else {
        __n = 0;
      }
      iVar4 = memcmp(a,b,__n);
      bVar3 = SUB41((uint)iVar4 >> 0x1f,0);
    }
    else {
      bVar3 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool operator<(const CPubKey& a, const CPubKey& b)
    {
        return a.vch[0] < b.vch[0] ||
               (a.vch[0] == b.vch[0] && memcmp(a.vch, b.vch, a.size()) < 0);
    }